

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::initActiveControl(PeleLM *this)

{
  double *pdVar1;
  ostringstream *poVar2;
  double dVar3;
  uint uVar4;
  double *pdVar5;
  Real *pRVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Real RVar11;
  long lVar12;
  undefined4 uVar13;
  ProbParm *pPVar14;
  ACParm *pAVar15;
  ACParm *pAVar16;
  DataContainer *pDVar17;
  pointer pdVar18;
  int i_2;
  int dim;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  int k;
  int iVar30;
  ulong uVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  DeviceVector<amrex::Real> s_ext_v;
  ParmParse ppAC;
  GpuArray<double,_13U> pmf_vals;
  Real s_ext [16];
  Real local_378;
  double dStack_370;
  Real local_368;
  PODVector<double,_std::allocator<double>_> local_358;
  double local_338 [4];
  undefined1 local_318 [16];
  double local_308;
  double dStack_300;
  undefined1 *local_2f8;
  ParmParse local_2f0;
  undefined1 local_298 [24];
  double adStack_280 [43];
  double adStack_128 [4];
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8 [3];
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  undefined5 uStack_98;
  undefined3 uStack_93;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  
  if ((this->super_NavierStokesBase).super_AmrLevel.level == 0) {
    if (1 < NavierStokesBase::verbose) {
      local_298._8_8_ = amrex::OutStream();
      local_298._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      local_298._0_4_ = *(int *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_298 + 0x10));
      *(undefined8 *)((long)adStack_280 + *(long *)(local_298._16_8_ - 0x18)) =
           *(undefined8 *)
            ((long)(local_298._8_8_ + 8) +
            *(long *)(((_Alloc_hider *)local_298._8_8_)->_M_p + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_298 + 0x10),"PeleLM::initActiveControl()\n",0x1c);
      amrex::Print::~Print((Print *)local_298);
    }
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"active_control","");
    amrex::ParmParse::ParmParse(&local_2f0,(string *)local_298);
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    amrex::ParmParse::query(&local_2f0,"on",&ctrl_active,0);
    amrex::ParmParse::query(&local_2f0,"use_temp",&ctrl_use_temp,0);
    amrex::ParmParse::query(&local_2f0,"temperature",&ctrl_temperature,0);
    amrex::ParmParse::query(&local_2f0,"tau",&ctrl_tauControl,0);
    amrex::ParmParse::query(&local_2f0,"v",&ctrl_verbose,0);
    amrex::ParmParse::query(&local_2f0,"height",&ctrl_h,0);
    amrex::ParmParse::query(&local_2f0,"changeMax",&ctrl_changeMax,0);
    amrex::ParmParse::query(&local_2f0,"velMax",&ctrl_velMax,0);
    amrex::ParmParse::query(&local_2f0,"pseudo_gravity",&ctrl_pseudoGravity,0);
    amrex::ParmParse::query(&local_2f0,"flame_direction",&ctrl_flameDir,0);
    amrex::ParmParse::query(&local_2f0,"AC_history",&ctrl_AChistory_abi_cxx11_,0);
    amrex::ParmParse::query(&local_2f0,"npoints_average",&ctrl_NavgPts,0);
    amrex::ParmParse::query(&local_2f0,"method",&ctrl_method,0);
    if ((ctrl_use_temp == true) && (ctrl_temperature <= 0.0)) {
      amrex::Error_host("active_control.temperature MUST be set with active_control.use_temp = 1");
    }
    if ((ctrl_active == true) && (ctrl_tauControl <= 0.0)) {
      amrex::Error_host("active_control.tau MUST be set when using active_control");
    }
    if (((ctrl_active & 1U) != 0) && (ctrl_h <= 0.0)) {
      amrex::Error_host("active_control.height MUST be set when using active_control");
    }
    if (((ctrl_active & 1U) != 0) && (2 < ctrl_flameDir)) {
      amrex::Error_host("active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.");
    }
    pAVar15 = ac_parm;
    if ((ctrl_active & 1U) == 0) {
      ac_parm->ctrl_active = 0;
      pAVar16 = ac_parm_d;
      uVar4 = pAVar15->ctrl_active;
      uVar13 = *(undefined4 *)&pAVar15->field_0x1c;
      ac_parm_d->ctrl_tBase = pAVar15->ctrl_tBase;
      pAVar16->ctrl_active = uVar4;
      *(undefined4 *)&pAVar16->field_0x1c = uVar13;
      RVar11 = pAVar15->ctrl_V_in;
      pAVar16->ctrl_dV = pAVar15->ctrl_dV;
      pAVar16->ctrl_V_in = RVar11;
    }
    else {
      ac_parm->ctrl_active = 1;
      local_298._0_8_ = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_time_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,(value_type_conflict2 *)local_298);
      local_298._0_8_ = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_velo_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,(value_type_conflict2 *)local_298);
      local_298._0_8_ = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_cntl_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,(value_type_conflict2 *)local_298);
      pDVar17 = pmf_data.m_data_d;
      pPVar14 = prob_parm_d;
      dVar7 = 1.0;
      uVar19 = 0;
      do {
        if ((uint)ctrl_flameDir != uVar19) {
          dVar7 = dVar7 * ((this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi
                           [uVar19] -
                          (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[uVar19]
                          );
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != 3);
      local_358.m_capacity = 0;
      local_358.m_data = (double *)0x0;
      local_358.m_size = 0;
      amrex::PODVector<double,_std::allocator<double>_>::AllocateBuffer(&local_358,0x12);
      pdVar18 = local_358.m_data;
      local_358.m_size = 0x10;
      dVar8 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[1];
      local_378 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[0];
      dStack_370 = dVar8;
      local_368 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[2];
      (&local_378)[ctrl_flameDir] = (&local_378)[ctrl_flameDir] + -1.0;
      dVar8 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi[1] - dVar8;
      dVar33 = dStack_370 + -0.004598;
      dVar35 = dStack_370 + -0.00712435;
      dVar34 = dStack_370 + -0.0033;
      dVar32 = dStack_370 + -0.014234;
      pdVar18[2] = 0.0;
      *pdVar18 = 0.0;
      pdVar18[1] = 0.0;
      dVar3 = pPVar14->MeanFlow;
      dVar38 = sin((dStack_370 * 25.132741228718345) / dVar8);
      dVar33 = sin((dVar33 * 12.566370614359172) / dVar8);
      dVar35 = sin((dVar35 * 18.84955592153876) / dVar8);
      dVar34 = sin((dVar34 * 31.41592653589793) / dVar8);
      dVar8 = sin((dVar32 * 0.0031415926535897933) / dVar8);
      dVar3 = (dVar8 * 1.0982 + dVar34 * 0.917 + dVar35 * 0.945 + dVar33 * 1.023 + dVar38) *
              dVar3 * 0.1 * 2.061830580524281e-12 * 0.18617949512112375;
      iVar30 = pPVar14->FlowDir;
      if (iVar30 == 0) {
        *pdVar18 = pPVar14->MeanFlow;
        pdVar18[1] = dVar3;
      }
      else if (iVar30 == 1) {
        pdVar18[1] = pPVar14->MeanFlow;
        *pdVar18 = dVar3;
      }
      else if (iVar30 == 2) {
        pdVar18[2] = pPVar14->MeanFlow;
      }
      adStack_280[7] = 0.0;
      adStack_280[8] = 0.0;
      adStack_280[5] = 0.0;
      adStack_280[6] = 0.0;
      adStack_280[3] = 0.0;
      adStack_280[4] = 0.0;
      adStack_280[1] = 0.0;
      adStack_280[2] = 0.0;
      local_298._16_8_ = 0;
      adStack_280[0] = 0.0;
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (pointer)0x0;
      adStack_280[9] = 0.0;
      pdVar5 = pDVar17->pmf_X;
      uVar4 = pDVar17->m_nPoint;
      uVar31 = (ulong)(uVar4 - 1);
      uVar19 = (ulong)-(uint)(*pdVar5 <= -1.0);
      if (pdVar5[uVar31] <= -1.0 && pdVar5[uVar31] != -1.0) {
        uVar19 = uVar31;
      }
      uVar25 = (uint)uVar19;
      if (pDVar17->m_doAverage == 0) {
        uVar23 = uVar25;
        if (uVar25 == 0xffffffff) {
          if (uVar31 == 0) {
            uVar25 = 0xffffffff;
            uVar23 = 0xffffffff;
          }
          else {
            uVar23 = 0xffffffff;
            uVar24 = 0;
            uVar19 = 0xffffffff;
            do {
              if ((pdVar5[uVar24] <= -1.0) && (-1.0 <= pdVar5[uVar24 + 1])) {
                uVar23 = (int)uVar24 + 1;
                uVar19 = uVar24 & 0xffffffff;
              }
              uVar25 = (uint)uVar19;
              uVar24 = uVar24 + 1;
            } while (uVar31 != uVar24);
          }
        }
        uVar27 = pDVar17->m_nVar;
        if (uVar27 != 0) {
          dVar3 = pdVar5[(int)uVar25];
          pRVar6 = pDVar17->pmf_Y;
          uVar29 = 0;
          uVar21 = uVar23;
          uVar28 = uVar25;
          do {
            dVar38 = pRVar6[uVar28];
            dVar33 = 0.0;
            if (uVar25 != uVar23) {
              dVar33 = (pRVar6[uVar21] - dVar38) / (pdVar5[(int)uVar23] - dVar3);
            }
            *(double *)(local_298 + (long)(int)uVar29 * 8) = dVar33 * (-1.0 - dVar3) + dVar38;
            uVar29 = uVar29 + 1;
            uVar21 = uVar21 + uVar4;
            uVar28 = uVar28 + uVar4;
          } while (uVar27 != uVar29);
        }
      }
      else {
        uVar23 = uVar25;
        uVar27 = uVar25;
        if (uVar25 == 0xffffffff) {
          uVar19 = 0xffffffff;
          if (uVar31 == 0) {
            uVar23 = 0xffffffff;
            uVar27 = 0xffffffff;
            uVar25 = 0xffffffff;
          }
          else {
            uVar26 = 0;
            uVar24 = 0xffffffff;
            do {
              if ((pdVar5[uVar26] <= -1.0) && (-1.0 <= pdVar5[uVar26 + 1])) {
                uVar19 = (ulong)((int)uVar26 + 1);
                uVar24 = uVar26 & 0xffffffff;
              }
              uVar23 = (uint)uVar24;
              uVar26 = uVar26 + 1;
            } while (uVar31 != uVar26);
            uVar25 = 0xffffffff;
            uVar26 = 0;
            uVar24 = 0xffffffff;
            do {
              if ((pdVar5[uVar26] <= -1.0) && (-1.0 <= pdVar5[uVar26 + 1])) {
                uVar25 = (int)uVar26 + 1;
                uVar24 = uVar26 & 0xffffffff;
              }
              uVar27 = (uint)uVar24;
              uVar26 = uVar26 + 1;
            } while (uVar31 != uVar26);
          }
        }
        uVar21 = pDVar17->m_nVar;
        if (uVar21 != 0) {
          dVar3 = pdVar5[(int)uVar23];
          pRVar6 = pDVar17->pmf_Y;
          uVar28 = (uint)uVar19;
          dVar38 = pdVar5[(int)uVar28];
          uVar29 = 0;
          do {
            iVar30 = uVar29 * uVar4;
            dVar33 = 0.0;
            if (uVar23 != uVar28) {
              dVar33 = (pRVar6[iVar30 + uVar28] - pRVar6[iVar30 + uVar23]) / (dVar38 - dVar3);
            }
            dVar33 = dVar33 * (-1.0 - dVar3) + pRVar6[iVar30 + uVar23];
            iVar22 = (int)uVar19;
            if (uVar23 == uVar27) {
              dVar33 = (dVar33 + dVar33) * 0.5;
            }
            else {
              dVar35 = pRVar6[iVar30 + uVar27];
              dVar34 = 0.0;
              if (uVar27 != uVar25) {
                dVar34 = (pRVar6[iVar30 + uVar25] - dVar35) /
                         (pdVar5[(int)uVar25] - pdVar5[(int)uVar27]);
              }
              dVar8 = -1.0 - pdVar5[(int)uVar27];
              dVar33 = (dVar34 * dVar8 + dVar35 + dVar35) * dVar8 * 0.5 +
                       (pRVar6[iVar30 + uVar28] + dVar33) * (dVar38 + 1.0) * 0.5;
              lVar20 = (long)(int)uVar28;
              dVar35 = dVar38;
              if ((int)uVar28 < (int)uVar27) {
                do {
                  lVar12 = lVar20 + 1;
                  lVar20 = lVar20 + 1;
                  pdVar1 = pRVar6 + uVar19;
                  uVar19 = (ulong)((int)uVar19 + 1);
                  dVar33 = dVar33 + (*pdVar1 + pRVar6[uVar19]) * (pdVar5[lVar12] - dVar35) * 0.5;
                  dVar35 = pdVar5[lVar12];
                } while ((int)uVar27 != lVar20);
              }
              dVar33 = dVar33 / 0.0;
            }
            *(double *)(local_298 + (long)(int)uVar29 * 8) = dVar33;
            uVar29 = uVar29 + 1;
            uVar19 = (ulong)(iVar22 + uVar4);
          } while (uVar29 != uVar21);
        }
      }
      pdVar18[0xe] = (double)local_298._0_8_;
      dVar38 = 1.0 / (adStack_280[7] * 34.014 +
                      adStack_280[6] * 33.006 +
                      adStack_280[5] * 17.007 +
                      adStack_280[4] * 15.999 +
                      adStack_280[3] * 1.008 +
                      adStack_280[2] * 18.015 +
                      adStack_280[1] * 31.998 + adStack_280[0] * 2.016 + 0.0 +
                     adStack_280[8] * 28.014);
      dVar3 = adStack_280[1] * 31.998 * dVar38;
      local_108._8_4_ = SUB84(dVar3,0);
      local_108._0_8_ = adStack_280[0] * 2.016 * dVar38;
      local_108._12_4_ = (int)((ulong)dVar3 >> 0x20);
      local_f8 = adStack_280[2] * 18.015 * dVar38;
      dStack_f0 = adStack_280[3] * 1.008 * dVar38;
      local_e8 = adStack_280[4] * 15.999 * dVar38;
      dStack_e0 = adStack_280[5] * 17.007 * dVar38;
      local_d8 = adStack_280[6] * 33.006 * dVar38;
      dStack_d0 = adStack_280[7] * 34.014 * dVar38;
      local_c8 = adStack_280[8] * 28.014 * dVar38;
      dVar3 = pPVar14->P_mean;
      local_338[0] = 0.49603174603174605;
      local_338[1] = 0.03125195324707794;
      local_338[2] = 0.055509297807382736;
      local_338[3] = 0.9920634920634921;
      local_318._8_8_ = 0x3fae1af1b70e12fe;
      local_318._0_8_ = 0x3fb000418a43bf8c;
      local_308 = 0.030297521662727988;
      dStack_300 = 0.029399658963956014;
      local_2f8 = &DAT_3fa246cdaf410bdd;
      lVar20 = 0;
      do {
        local_b8[lVar20] = *(double *)(local_108 + lVar20 * 8) * local_338[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 9);
      dVar38 = 0.0;
      lVar20 = 0;
      do {
        dVar38 = dVar38 + local_b8[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 9);
      dVar3 = ((dVar3 * 10.0) / (dVar38 * (double)local_298._0_8_ * 83144626.1815324)) * 1000.0;
      pdVar18[3] = dVar3;
      dVar34 = (double)local_298._0_8_ * (double)local_298._0_8_;
      dVar35 = (double)local_298._0_8_ * dVar34;
      dVar33 = (double)local_298._0_8_ * dVar35;
      local_b8[0] = 0.49603174603174605;
      local_b8[1] = 0.03125195324707794;
      local_b8[2] = 0.055509297807382736;
      uStack_a0 = 0xfbefbefbf0;
      uStack_9b = 0x3fefbe;
      uStack_98 = 0x418a43bf8c;
      uStack_93 = 0x3fb000;
      uStack_90 = 0x3fae1af1b70e12fe;
      local_88 = 0x3f9f065042c3dbd3;
      uStack_80 = 0x3f9e1af1b70e12fe;
      local_78 = &DAT_3fa246cdaf410bdd;
      dVar38 = 1.0 / (double)local_298._0_8_;
      if (1000.0 <= (double)local_298._0_8_) {
        local_338[0] = dVar38 * -835.033997 +
                       dVar33 * 3.16550358e-16 +
                       dVar35 * -2.30789455e-12 +
                       dVar34 * -1.8779429e-08 +
                       (double)local_298._0_8_ * 0.000350032206 + 2.99142337;
        local_338[1] = dVar38 * -1233.93018 +
                       dVar33 * -2.27287062e-16 +
                       dVar35 * 4.4382037e-12 +
                       dVar34 * -4.19613997e-08 +
                       (double)local_298._0_8_ * 0.000306759845 + 3.69757819;
        dVar9 = dVar38 * 29230.8027 +
                dVar33 * -8.736103e-17 +
                dVar35 * 1.13776685e-12 +
                dVar34 * -1.03426778e-09 + (double)local_298._0_8_ * -1.37753096e-05 + 2.54205966;
        dVar10 = dVar38 * 3683.62875 +
                 dVar33 * -2.66391752e-16 +
                 dVar35 * 7.63046685e-12 +
                 dVar34 * -8.63609193e-08 + (double)local_298._0_8_ * 0.00052825224 + 2.86472886;
        local_308 = dVar38 * 111.856713 +
                    dVar33 * -2.1581707e-15 +
                    dVar35 * 2.85615925e-11 +
                    dVar34 * -2.11219383e-07 + (double)local_298._0_8_ * 0.00111991006 + 4.0172109;
        dStack_300 = dVar38 * -18006.9609 +
                     dVar33 * -2.86330712e-15 +
                     dVar35 * 5.87225893e-11 +
                     dVar34 * -4.9156294e-07 + (double)local_298._0_8_ * 0.0021680682 + 4.57316685;
        dVar36 = dVar33 * -1.27832357e-15 +
                 dVar35 * 3.00249098e-11 +
                 dVar34 * -2.9100867e-07 + (double)local_298._0_8_ * 0.00152814644 + 2.67214561;
        dVar37 = dVar33 * -1.3506702e-15 +
                 dVar35 * 2.52426e-11 +
                 dVar34 * -1.89492033e-07 + (double)local_298._0_8_ * 0.0007439885 + 2.92664;
        dVar8 = -29899.209;
        dVar32 = -922.7977;
      }
      else {
        local_338[0] = dVar38 * -1012.52087 +
                       dVar33 * 8.26974448e-14 +
                       dVar35 * -2.36885858e-11 +
                       dVar34 * -2.71433843e-07 +
                       (double)local_298._0_8_ * 0.000412472087 + 3.29812431;
        local_338[1] = dVar38 * -1005.24902 +
                       dVar33 * -1.75371078e-13 +
                       dVar35 * 3.28469308e-10 +
                       dVar34 * -1.91871682e-07 +
                       (double)local_298._0_8_ * 0.000563743175 + 3.2129364;
        dVar9 = dVar38 * 29147.6445 +
                dVar33 * 7.78139272e-14 +
                dVar35 * -4.00710797e-10 +
                dVar34 * 8.07010567e-07 + (double)local_298._0_8_ * -0.000819083245 + 2.94642878;
        dVar10 = dVar38 * 3346.30913 +
                 dVar33 * 4.12474758e-13 +
                 dVar35 * -1.44963411e-09 +
                 dVar34 * 2.1758823e-06 + (double)local_298._0_8_ * -0.0016127247 + 4.12530561;
        local_308 = dVar38 * 294.80804 +
                    dVar33 * 1.85845025e-12 +
                    dVar35 * -6.06909735e-09 +
                    dVar34 * 7.05276303e-06 + (double)local_298._0_8_ * -0.00237456025 + 4.30179801;
        dStack_300 = dVar38 * -17663.1465 +
                     dVar33 * 4.9430295e-13 +
                     dVar35 * -1.15645138e-09 +
                     dVar34 * -4.95004193e-08 + (double)local_298._0_8_ * 0.0032846129 + 3.38875365;
        dVar36 = dVar33 * -5.01317694e-13 +
                 dVar35 * 1.74214532e-09 +
                 dVar34 * -2.11823211e-06 + (double)local_298._0_8_ * 0.00173749123 + 3.38684249;
        dVar37 = dVar33 * -4.88971e-13 +
                 dVar35 * 1.41037875e-09 +
                 dVar34 * -1.321074e-06 + (double)local_298._0_8_ * 0.00070412 + 3.298677;
        dVar8 = -30208.1133;
        dVar32 = -1020.9;
      }
      local_338[2] = dVar38 * dVar8 + dVar36;
      local_338[3] = dVar38 * 25471.627 +
                     dVar33 * 0.0 +
                     dVar35 * 0.0 + dVar34 * 0.0 + (double)local_298._0_8_ * 0.0 + 2.5;
      local_318._8_4_ = SUB84(dVar10,0);
      local_318._0_8_ = dVar9;
      local_318._12_4_ = (int)((ulong)dVar10 >> 0x20);
      local_2f8 = (undefined1 *)(dVar38 * dVar32 + dVar37);
      lVar20 = 0;
      do {
        local_338[lVar20] =
             local_b8[lVar20] * (double)local_298._0_8_ * 83144626.1815324 * local_338[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 9);
      dVar38 = 0.0;
      lVar20 = 0;
      do {
        dVar38 = dVar38 + *(double *)(local_108 + lVar20 * 8) * local_338[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 9);
      pdVar18[0xd] = dVar3 * 0.0001 * dVar38;
      lVar20 = 4;
      do {
        pdVar18[lVar20] = adStack_128[lVar20] * dVar3;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0xd);
      uStack_98 = (undefined5)((ulong)*(undefined8 *)((long)pdVar18 + 0x1d) >> 0x18);
      local_b8[2] = pdVar18[2];
      uStack_a0 = SUB85(pdVar18[3],0);
      uStack_9b = (undefined3)((ulong)pdVar18[3] >> 0x28);
      local_b8[0] = *pdVar18;
      local_b8[1] = pdVar18[1];
      if (ctrl_use_temp == false) {
        if (fuelName_abi_cxx11_._M_string_length == 0) {
          amrex::Abort_host("Using activeControl based on fuel mass requires ns.fuelName !");
        }
        local_298._0_8_ = (pointer)0x0;
        local_298._8_8_ = (pointer)0x0;
        local_298._16_8_ = 0;
        pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
                  ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_298);
        uVar19 = 0xffffffff;
        lVar20 = 0;
        uVar31 = 0;
        do {
          iVar30 = std::__cxx11::string::compare((string *)(local_298._0_8_ + lVar20));
          if (iVar30 == 0) {
            uVar19 = uVar31 & 0xffffffff;
          }
          uVar31 = uVar31 + 1;
          lVar20 = lVar20 + 0x20;
        } while (uVar31 != 9);
        ctrl_scale = dVar7 * local_b8[(long)(int)uVar19 + (long)first_spec];
        ctrl_cfix = ctrl_scale * ctrl_h;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_298);
      }
      else {
        ctrl_scale = 1.0;
        ctrl_cfix = ctrl_h;
      }
      pAVar15 = ac_parm;
      ctrl_V_in = local_b8[ctrl_flameDir];
      ctrl_V_in_old = ctrl_V_in;
      ac_parm->ctrl_V_in = ctrl_V_in;
      pAVar16 = ac_parm_d;
      uVar4 = pAVar15->ctrl_active;
      uVar13 = *(undefined4 *)&pAVar15->field_0x1c;
      ac_parm_d->ctrl_tBase = pAVar15->ctrl_tBase;
      pAVar16->ctrl_active = uVar4;
      *(undefined4 *)&pAVar16->field_0x1c = uVar13;
      RVar11 = pAVar15->ctrl_V_in;
      pAVar16->ctrl_dV = pAVar15->ctrl_dV;
      pAVar16->ctrl_V_in = RVar11;
      if ((ctrl_verbose != 0) && (ctrl_active == true)) {
        if (ctrl_use_temp == true) {
          local_298._8_8_ = amrex::OutStream();
          poVar2 = (ostringstream *)(local_298 + 0x10);
          local_298._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
          local_298._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          *(undefined8 *)((long)adStack_280 + *(long *)(local_298._16_8_ - 0x18)) =
               *(undefined8 *)
                ((long)(local_298._8_8_ + 8) +
                *(long *)(((_Alloc_hider *)local_298._8_8_)->_M_p + -0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2," Active control based on temperature iso-level activated.",
                     0x39);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2," Maintaining the flame at ",0x1a);
          std::ostream::_M_insert<double>(ctrl_h);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," in ",4);
          std::ostream::operator<<(poVar2,ctrl_flameDir);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," direction. \n",0xd)
          ;
        }
        else {
          local_298._8_8_ = amrex::OutStream();
          poVar2 = (ostringstream *)(local_298 + 0x10);
          local_298._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
          local_298._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          *(undefined8 *)((long)adStack_280 + *(long *)(local_298._16_8_ - 0x18)) =
               *(undefined8 *)
                ((long)(local_298._8_8_ + 8) +
                *(long *)(((_Alloc_hider *)local_298._8_8_)->_M_p + -0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2," Active control based on fuel mass activated.",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2," Maintaining the flame at ",0x1a);
          std::ostream::_M_insert<double>(ctrl_h);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," in ",4);
          std::ostream::operator<<(poVar2,ctrl_flameDir);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," direction. \n",0xd)
          ;
        }
        amrex::Print::~Print((Print *)local_298);
      }
      if (local_358.m_data != (double *)0x0) {
        operator_delete(local_358.m_data,local_358.m_capacity << 3);
      }
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2f0);
  }
  return;
}

Assistant:

void
PeleLM::initActiveControl()
{
   if (level!=0) return;

   if (verbose > 1) Print() <<  "PeleLM::initActiveControl()\n";

   // Parse input file
   ParmParse ppAC("active_control");
   ppAC.query("on",ctrl_active);
   ppAC.query("use_temp",ctrl_use_temp);
   ppAC.query("temperature",ctrl_temperature);
   ppAC.query("tau",ctrl_tauControl);
   ppAC.query("v",ctrl_verbose);
   ppAC.query("height",ctrl_h);
   ppAC.query("changeMax",ctrl_changeMax);
   ppAC.query("velMax",ctrl_velMax);
   ppAC.query("pseudo_gravity",ctrl_pseudoGravity);
   ppAC.query("flame_direction",ctrl_flameDir);
   ppAC.query("AC_history",ctrl_AChistory);
   ppAC.query("npoints_average",ctrl_NavgPts);
   ppAC.query("method",ctrl_method);

   // Active control checks
   if ( ctrl_use_temp && (ctrl_temperature <= 0.0) )
      amrex::Error("active_control.temperature MUST be set with active_control.use_temp = 1");

   if ( ctrl_active && (ctrl_tauControl <= 0.0) )
      amrex::Error("active_control.tau MUST be set when using active_control");

   if ( ctrl_active && (ctrl_h <= 0.0) )
      amrex::Error("active_control.height MUST be set when using active_control");

   if ( ctrl_active && ( ctrl_flameDir > 2 ) )
      amrex::Error("active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.");

   // Exit here if AC not activated
   if ( !ctrl_active ) {
      ac_parm->ctrl_active = ctrl_active;
      amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);
      return;
   }

   // Activate AC in problem specific / GPU compliant sections
   ac_parm->ctrl_active = ctrl_active;

   // Resize vector for temporal average
   ctrl_time_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_velo_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_cntl_pts.resize(ctrl_NavgPts+1,-1.0);

   // Compute some active control parameters
   Real area_tot = 1.0;
   const Real* problo = geom.ProbLo();
   const Real* probhi = geom.ProbHi();
   for (int dim = 0; dim < AMREX_SPACEDIM; dim++) {
      if (dim != ctrl_flameDir) area_tot *= (probhi[dim] - problo[dim]);
   }

   // Extract data from bc: assumes flow comes in from lo side of ctrl_flameDir
   ProbParm const* lprobparm = prob_parm_d;
   ACParm const* lacparm = ac_parm_d;
   pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();
   amrex::Gpu::DeviceVector<amrex::Real> s_ext_v(DEF_NUM_STATE);
   amrex::Real* s_ext_d = s_ext_v.data();
   amrex::Real x[AMREX_SPACEDIM] = {AMREX_D_DECL(problo[0],problo[1],problo[2])};
   x[ctrl_flameDir] -= 1.0;
   const int ctrl_flameDir_l = ctrl_flameDir;
   const amrex::Real time_l = -1.0;
   const auto geomdata = geom.data();
   Box dumbx({AMREX_D_DECL(0,0,0)},{AMREX_D_DECL(0,0,0)});
   amrex::ParallelFor(dumbx, [x,s_ext_d,ctrl_flameDir_l,time_l,geomdata,lprobparm,lacparm, lpmfdata]
   AMREX_GPU_DEVICE(int /*i*/, int /*j*/, int /*k*/) noexcept
   {
      bcnormal(x, s_ext_d, ctrl_flameDir_l, 1, time_l, geomdata, *lprobparm, *lacparm, lpmfdata);
   });
   amrex::Real s_ext[DEF_NUM_STATE];
#ifdef AMREX_USE_GPU
   amrex::Gpu::dtoh_memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#else
   std::memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#endif

   if ( !ctrl_use_temp ) {
      // Get the fuel rhoY
      if (fuelName.empty()) {
          Abort("Using activeControl based on fuel mass requires ns.fuelName !");
      }
      Vector<std::string> specNames;
      pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
      int fuelidx = -1;
      for (int k = 0; k < NUM_SPECIES; k++) {
         if ( !specNames[k].compare(fuelName) ) fuelidx = k;
      }
      ctrl_scale = area_tot * s_ext[first_spec+fuelidx];
      ctrl_cfix  = ctrl_h * ctrl_scale;
   } else {
      // If using temp, scale is 1.0
      ctrl_scale = 1.0;
      ctrl_cfix = ctrl_h;
   }

   // Extract initial ctrl_V_in from bc
   ctrl_V_in  = s_ext[ctrl_flameDir];
   ctrl_V_in_old = ctrl_V_in;

   // Pass V_in to bc
   ac_parm->ctrl_V_in = ctrl_V_in;
   amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);

   if ( ctrl_verbose && ctrl_active ) {
      if ( ctrl_use_temp ) {
         Print() << " Active control based on temperature iso-level activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      } else {
         Print() << " Active control based on fuel mass activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      }
   }
}